

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O0

void BuilderTests<TestHeapBuilder,_TestHeapBuilder>::all_tests(void)

{
  TestHeapBuilder local_88;
  
  empty_builder_movector_test();
  nonempty_builder_movector_test();
  builder_movector_before_finish_test();
  builder_movector_after_finish_test();
  builder_move_assign_before_finish_test();
  builder_move_assign_after_finish_test();
  builder_move_assign_after_release_test();
  TestHeapBuilder::TestHeapBuilder(&local_88);
  builder_move_assign_after_releaseraw_test<TestHeapBuilder>(&local_88);
  TestHeapBuilder::~TestHeapBuilder(&local_88);
  builder_swap_before_finish_test(true);
  builder_swap_after_finish_test(true);
  return;
}

Assistant:

static void all_tests() {
    empty_builder_movector_test();
    nonempty_builder_movector_test();
    builder_movector_before_finish_test();
    builder_movector_after_finish_test();
    builder_move_assign_before_finish_test();
    builder_move_assign_after_finish_test();
    builder_move_assign_after_release_test();
    builder_move_assign_after_releaseraw_test(DestBuilder());
    builder_swap_before_finish_test();
    builder_swap_after_finish_test();
  }